

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_PC_StartCurrentNetworkSuccess_Test::TestBody
          (InterpreterTestSuite_PC_StartCurrentNetworkSuccess_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__return_storage_ptr__;
  bool bVar1;
  CommissionerAppMock *pCVar2;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *pTVar3;
  TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *pTVar4;
  long lVar5;
  char *expected_predicate_value;
  char *pcVar6;
  initializer_list<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>
  __l;
  uint8_t camIdx;
  Status local_550;
  allocator local_54f;
  allocator local_54e;
  allocator local_54d;
  allocator local_54c;
  allocator local_54b;
  allocator local_54a;
  allocator local_549;
  Expression expr;
  _Any_data local_528;
  long local_518;
  undefined8 uStack_510;
  undefined1 local_508 [16];
  code *local_4f8;
  code *pcStack_4f0;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  undefined1 local_4b0 [72];
  Value value;
  MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&> local_418;
  Registry *local_3f8;
  State local_3f0;
  State local_3ec;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3e8;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d0;
  CommissionerAppMockPtr commissionerAppMocks [2];
  _Any_data local_3a8;
  code *local_398;
  code *pcStack_390;
  __shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> local_380;
  UnixTime local_370;
  UnixTime local_368;
  undefined1 local_360 [8];
  _Alloc_hider local_358;
  size_type local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  undefined1 local_338 [8];
  _Alloc_hider local_330;
  size_type local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  undefined1 local_310 [8];
  _Alloc_hider local_308;
  size_type local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  BorderRouter br;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  local_3f8 = ctx.mRegistry;
  std::__cxx11::string::string((string *)&value,"127.0.0.1",(allocator *)&camIdx);
  local_3e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)local_4b0,"1.1",&local_549);
  ot::commissioner::BorderAgent::State::State(&local_3ec,0,0,0,0,0);
  std::__cxx11::string::string((string *)&expr,"net1",&local_54a);
  std::__cxx11::string::string((string *)&gtest_ar_,"",&local_54b);
  std::__cxx11::string::string((string *)local_528._M_pod_data,"",&local_54c);
  std::__cxx11::string::string((string *)local_508,"",&local_54d);
  local_418._vptr_MatcherBase = (_func_int **)0x0;
  local_418.impl_.
  super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_418.impl_.
  super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)commissionerAppMocks,"domain1",&local_54e);
  pcVar6 = "";
  std::__cxx11::string::string((string *)local_3a8._M_pod_data,"",&local_54f);
  ot::commissioner::UnixTime::UnixTime(&local_368,0);
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&br,(string *)&value,0x4e21,(ByteArray *)&local_3e8,(string *)local_4b0,
             local_3ec,(string *)&expr,1,(string *)&gtest_ar_,(string *)&local_528,(Timestamp)0x0,0,
             (string *)local_508,(ByteArray *)&local_418,(string *)commissionerAppMocks,'\0',0,
             (string *)&local_3a8,local_368,0x103f);
  local_380._M_ptr._0_1_ =
       ot::commissioner::persistent_storage::Registry::Add(local_3f8,(BorderAgent *)&br);
  local_550 = kSuccess;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
            ((internal *)&gtest_ar,
             "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
             ,"RegistryStatus::kSuccess",(Status *)&local_380,&local_550);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
  std::__cxx11::string::~string((string *)local_3a8._M_pod_data);
  std::__cxx11::string::~string((string *)commissionerAppMocks);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_418);
  std::__cxx11::string::~string((string *)local_508);
  std::__cxx11::string::~string((string *)local_528._M_pod_data);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&expr);
  std::__cxx11::string::~string((string *)local_4b0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3e8);
  std::__cxx11::string::~string((string *)&value);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&br);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x378,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&br);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if (br._vptr_BorderRouter != (_func_int **)0x0) {
      (**(code **)(*br._vptr_BorderRouter + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    local_3f8 = ctx.mRegistry;
    std::__cxx11::string::string((string *)&value,"127.0.0.2",(allocator *)&camIdx);
    local_3e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)local_4b0,"1.1",&local_549);
    ot::commissioner::BorderAgent::State::State(&local_3f0,0,0,0,0,0);
    std::__cxx11::string::string((string *)&expr,"net2",&local_54a);
    std::__cxx11::string::string((string *)&gtest_ar_,"",&local_54b);
    std::__cxx11::string::string((string *)local_528._M_pod_data,"",&local_54c);
    std::__cxx11::string::string((string *)local_508,"",&local_54d);
    local_418._vptr_MatcherBase = (_func_int **)0x0;
    local_418.impl_.
    super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_418.impl_.
    super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::string((string *)commissionerAppMocks,"domain1",&local_54e);
    pcVar6 = "";
    std::__cxx11::string::string((string *)local_3a8._M_pod_data,"",&local_54f);
    ot::commissioner::UnixTime::UnixTime(&local_370,0);
    expected_predicate_value = (char *)(ulong)(uint)local_3f0;
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&br,(string *)&value,0x4e21,(ByteArray *)&local_3e8,
               (string *)local_4b0,local_3f0,(string *)&expr,2,(string *)&gtest_ar_,
               (string *)&local_528,(Timestamp)0x0,0,(string *)local_508,(ByteArray *)&local_418,
               (string *)commissionerAppMocks,'\0',0,(string *)&local_3a8,local_370,0x103f);
    local_380._M_ptr._0_1_ =
         ot::commissioner::persistent_storage::Registry::Add(local_3f8,(BorderAgent *)&br);
    local_550 = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              ((internal *)&gtest_ar,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
               ,"RegistryStatus::kSuccess",(Status *)&local_380,&local_550);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
    std::__cxx11::string::~string((string *)local_3a8._M_pod_data);
    std::__cxx11::string::~string((string *)commissionerAppMocks);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_418);
    std::__cxx11::string::~string((string *)local_508);
    std::__cxx11::string::~string((string *)local_528._M_pod_data);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&expr);
    std::__cxx11::string::~string((string *)local_4b0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3e8);
    std::__cxx11::string::~string((string *)&value);
    if (gtest_ar.success_ != false) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&br);
      ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&value,0);
      br.mNetworkId.mId = value.mError.mCode;
      local_4b0[0] = ot::commissioner::persistent_storage::Registry::SetCurrentNetwork
                               (ctx.mRegistry,&br);
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)expr.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                ((internal *)&value,"ctx.mRegistry->SetCurrentNetwork(br)",
                 "RegistryStatus::kSuccess",local_4b0,(Status *)&expr);
      if ((undefined1)value.mError.mCode == kNone) {
        testing::Message::Message((Message *)local_4b0);
        if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)value.mError.mMessage._M_dataplus._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&expr,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x381,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&expr,(Message *)local_4b0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expr);
        if ((long *)CONCAT71(local_4b0._1_7_,local_4b0[0]) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_4b0._1_7_,local_4b0[0]) + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&value.mError.mMessage);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&value.mError.mMessage);
        camIdx = '\0';
        pCVar2 = (CommissionerAppMock *)operator_new(0x1838);
        memset(pCVar2,0,0x1838);
        CommissionerAppMock::CommissionerAppMock(pCVar2);
        std::__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<CommissionerAppMock,void>
                  ((__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2> *)
                   commissionerAppMocks,pCVar2);
        pCVar2 = (CommissionerAppMock *)operator_new(0x1838);
        memset(pCVar2,0,0x1838);
        CommissionerAppMock::CommissionerAppMock(pCVar2);
        std::__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<CommissionerAppMock,void>
                  ((__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2> *)
                   (commissionerAppMocks + 1),pCVar2);
        testing::A<std::shared_ptr<ot::commissioner::CommissionerApp>&>();
        testing::A<ot::commissioner::Config_const&>();
        CommissionerAppStaticExpecter::gmock_Create
                  ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                    *)local_4b0,&ctx.mCommissionerAppStaticExpecter,
                   (Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)&local_418,
                   (Matcher<const_ot::commissioner::Config_&> *)&gtest_ar);
        testing::internal::GetWithoutMatchers();
        pTVar3 = testing::internal::
                 MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                 ::InternalExpectedAt
                           ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                             *)local_4b0,
                            "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                            ,0x386,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
        pTVar3 = testing::internal::
                 TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                 ::Times(pTVar3,2);
        local_310._0_4_ = kNone;
        local_308._M_p = (pointer)&local_2f8;
        local_300 = 0;
        local_2f8._M_local_buf[0] = '\0';
        testing::Return<ot::commissioner::Error>((testing *)&local_380,(Error *)local_310);
        std::__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> *)&local_3e8,
                   &local_380);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )&camIdx;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        gtest_ar_._0_8_ =
             (__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2> *)commissionerAppMocks;
        local_3e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)commissionerAppMocks;
        local_3d0._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )gtest_ar_.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
        std::_Function_base::~_Function_base((_Function_base *)&expr);
        std::function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)>::function
                  ((function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                   &local_528,
                   (function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                   &gtest_ar_);
        local_4f8 = (code *)0x0;
        pcStack_4f0 = (code *)0x0;
        local_508._0_8_ = (pointer)0x0;
        local_508._8_8_ = 0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_508._0_8_ = operator_new(0x20);
        *(undefined8 *)local_508._0_8_ = 0;
        *(undefined8 *)(local_508._0_8_ + 8) = 0;
        *(undefined8 *)(local_508._0_8_ + 0x10) = 0;
        *(undefined8 *)(local_508._0_8_ + 0x18) = uStack_510;
        if (local_518 != 0) {
          *(void **)local_508._0_8_ = local_528._M_unused._M_object;
          *(undefined8 *)(local_508._0_8_ + 8) = local_528._8_8_;
          *(long *)(local_508._0_8_ + 0x10) = local_518;
          local_518 = 0;
          uStack_510 = 0;
        }
        local_508._8_8_ =
             expr.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_4f8 = std::_Function_handler::operator_cast_to_Action;
        pcStack_4f0 = std::_Function_handler::operator_cast_to_Action;
        std::_Function_base::~_Function_base((_Function_base *)&expr);
        std::_Function_base::~_Function_base((_Function_base *)&local_528);
        std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
        __l._M_len = 1;
        __l._M_array = (iterator)local_508;
        std::
        vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
        ::vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                  *)&value,__l,(allocator_type *)&expr);
        std::_Function_base::~_Function_base((_Function_base *)local_508);
        __return_storage_ptr__ = &value.mError.mMessage.field_2;
        testing::internal::ReturnAction::operator_cast_to_Action
                  ((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                    *)__return_storage_ptr__,(ReturnAction *)&local_3e8);
        local_398 = (code *)0x0;
        pcStack_390 = (code *)0x0;
        local_3a8._M_unused._M_object = (void *)0x0;
        local_3a8._8_8_ = 0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3a8._M_unused._M_object = operator_new(0x38);
        *(undefined8 *)local_3a8._M_unused._0_8_ = value.mError._0_8_;
        *(pointer *)((long)local_3a8._M_unused._0_8_ + 8) = value.mError.mMessage._M_dataplus._M_p;
        *(size_type *)((long)local_3a8._M_unused._0_8_ + 0x10) =
             value.mError.mMessage._M_string_length;
        value.mError.mCode = kNone;
        value.mError._4_4_ = 0;
        value.mError.mMessage._M_dataplus._M_p = (pointer)0x0;
        value.mError.mMessage._M_string_length = 0;
        *(undefined8 *)((long)local_3a8._M_unused._0_8_ + 0x18) = 0;
        *(undefined8 *)((long)local_3a8._M_unused._0_8_ + 0x20) = 0;
        *(undefined8 *)((long)local_3a8._M_unused._0_8_ + 0x28) = 0;
        *(size_type *)((long)local_3a8._M_unused._0_8_ + 0x30) = value.mData._M_string_length;
        if (value.mData._M_dataplus._M_p != (pointer)0x0) {
          *(ulong *)((long)local_3a8._M_unused._0_8_ + 0x18) =
               CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                        value.mError.mMessage.field_2._M_local_buf[0]);
          *(undefined8 *)((long)local_3a8._M_unused._0_8_ + 0x20) =
               value.mError.mMessage.field_2._8_8_;
          *(pointer *)((long)local_3a8._M_unused._0_8_ + 0x28) = value.mData._M_dataplus._M_p;
          value.mData._M_dataplus._M_p = (pointer)0x0;
          value.mData._M_string_length = 0;
        }
        local_3a8._8_8_ =
             expr.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_398 = std::_Function_handler::operator_cast_to_Action;
        pcStack_390 = std::_Function_handler::operator_cast_to_Action;
        std::_Function_base::~_Function_base((_Function_base *)&expr);
        anon_func::Op::~Op((Op *)&value);
        testing::internal::
        TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
        ::WillRepeatedly(pTVar3,(Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                 *)&local_3a8);
        std::_Function_base::~_Function_base((_Function_base *)&local_3a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_3e8._M_impl.super__Vector_impl_data._M_finish);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_380._M_refcount);
        std::__cxx11::string::~string((string *)&local_308);
        std::
        _Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
        ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                        *)(local_4b0 + 8));
        testing::internal::MatcherBase<const_ot::commissioner::Config_&>::~MatcherBase
                  ((MatcherBase<const_ot::commissioner::Config_&> *)&gtest_ar);
        testing::internal::MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>::
        ~MatcherBase(&local_418);
        testing::A<std::__cxx11::string&>();
        testing::A<std::__cxx11::string_const&>();
        testing::A<unsigned_short>();
        CommissionerAppMock::gmock_Start
                  ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                    *)&value,
                   commissionerAppMocks[0].
                   super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)&expr,(Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                             *)&gtest_ar_,(Matcher<unsigned_short> *)&local_528);
        testing::internal::GetWithoutMatchers();
        pTVar4 = testing::internal::
                 MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                 ::InternalExpectedAt
                           ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                             *)&value,
                            "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                            ,0x38b,"*commissionerAppMocks[0]","Start(_, _, _)");
        pTVar4 = testing::internal::
                 TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                 ::Times(pTVar4,2);
        local_338._0_4_ = kNone;
        local_330._M_p = (pointer)&local_320;
        local_328 = 0;
        local_320._M_local_buf[0] = '\0';
        testing::Return<ot::commissioner::Error>((testing *)local_508,(Error *)local_338);
        testing::internal::ReturnAction::operator_cast_to_Action
                  ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                    *)local_4b0,(ReturnAction *)local_508);
        testing::internal::
        TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
        ::WillRepeatedly(pTVar4,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                 *)local_4b0);
        std::_Function_base::~_Function_base((_Function_base *)local_4b0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_508 + 8));
        std::__cxx11::string::~string((string *)&local_330);
        std::
        _Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
        ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
                        *)&value.mError.mMessage);
        testing::internal::MatcherBase<unsigned_short>::~MatcherBase
                  ((MatcherBase<unsigned_short> *)&local_528);
        testing::internal::
        MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_ar_);
        testing::internal::
        MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~MatcherBase((MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&expr);
        testing::A<std::__cxx11::string&>();
        testing::A<std::__cxx11::string_const&>();
        testing::A<unsigned_short>();
        CommissionerAppMock::gmock_Start
                  ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                    *)&value,
                   commissionerAppMocks[1].
                   super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)&expr,(Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                             *)&gtest_ar_,(Matcher<unsigned_short> *)&local_528);
        testing::internal::GetWithoutMatchers();
        pTVar4 = testing::internal::
                 MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                 ::InternalExpectedAt
                           ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                             *)&value,
                            "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                            ,0x38d,"*commissionerAppMocks[1]","Start(_, _, _)");
        pTVar4 = testing::internal::
                 TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                 ::Times(pTVar4,1);
        local_360._0_4_ = kNone;
        local_358._M_p = (pointer)&local_348;
        local_350 = 0;
        local_348._M_local_buf[0] = '\0';
        testing::Return<ot::commissioner::Error>((testing *)local_508,(Error *)local_360);
        testing::internal::ReturnAction::operator_cast_to_Action
                  ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                    *)local_4b0,(ReturnAction *)local_508);
        testing::internal::
        TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
        ::WillRepeatedly(pTVar4,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                 *)local_4b0);
        std::_Function_base::~_Function_base((_Function_base *)local_4b0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_508 + 8));
        std::__cxx11::string::~string((string *)&local_358);
        std::
        _Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
        ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
                        *)&value.mError.mMessage);
        testing::internal::MatcherBase<unsigned_short>::~MatcherBase
                  ((MatcherBase<unsigned_short> *)&local_528);
        testing::internal::
        MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_ar_);
        testing::internal::
        MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~MatcherBase((MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&expr);
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
        value.mError.mMessage._M_string_length = 0;
        value.mError.mMessage.field_2._M_local_buf[0] = '\0';
        value.mData._M_dataplus._M_p = (pointer)&value.mData.field_2;
        value.mData._M_string_length = 0;
        value.mData.field_2._M_local_buf[0] = '\0';
        value.mError.mMessage._M_dataplus._M_p = (pointer)__return_storage_ptr__;
        std::__cxx11::string::string
                  ((string *)local_4b0,"start --nwk this",(allocator *)local_528._M_pod_data);
        ot::commissioner::Interpreter::ParseExpression
                  ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)local_4b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&expr,&gtest_ar_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
        std::__cxx11::string::~string((string *)local_4b0);
        ot::commissioner::Interpreter::Eval((Value *)local_4b0,&ctx.mInterpreter,&expr);
        ot::commissioner::Interpreter::Value::operator=(&value,(Value *)local_4b0);
        ot::commissioner::Interpreter::Value::~Value((Value *)local_4b0);
        bVar1 = ot::commissioner::Interpreter::Value::HasNoError(&value);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = bVar1;
        if (!bVar1) {
          testing::Message::Message((Message *)&local_528);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_4b0,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,"false",
                     "true",expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_508,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x393,(char *)CONCAT71(local_4b0._1_7_,local_4b0[0]));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_508,(Message *)&local_528);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_508);
          std::__cxx11::string::~string((string *)local_4b0);
          if ((long *)local_528._M_unused._0_8_ != (long *)0x0) {
            (**(code **)(*local_528._M_unused._M_object + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        ot::commissioner::Interpreter::MultiNetCommandContext::Cleanup
                  ((MultiNetCommandContext *)&ctx);
        ot::commissioner::JobManager::CleanupJobs
                  (ctx.mInterpreter.mJobManager.
                   super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        std::__cxx11::string::string
                  ((string *)local_4b0,"start --dom this",(allocator *)local_528._M_pod_data);
        ot::commissioner::Interpreter::ParseExpression
                  ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)local_4b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&expr,&gtest_ar_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
        std::__cxx11::string::~string((string *)local_4b0);
        ot::commissioner::Interpreter::Eval((Value *)local_4b0,&ctx.mInterpreter,&expr);
        ot::commissioner::Interpreter::Value::operator=(&value,(Value *)local_4b0);
        ot::commissioner::Interpreter::Value::~Value((Value *)local_4b0);
        gtest_ar_.success_ = ot::commissioner::Interpreter::Value::HasNoError(&value);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_528);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_4b0,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,"false",
                     "true",expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_508,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x399,(char *)CONCAT71(local_4b0._1_7_,local_4b0[0]));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_508,(Message *)&local_528);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_508);
          std::__cxx11::string::~string((string *)local_4b0);
          if ((long *)local_528._M_unused._0_8_ != (long *)0x0) {
            (**(code **)(*local_528._M_unused._M_object + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        ot::commissioner::Interpreter::Value::~Value(&value);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&expr);
        lVar5 = 0x18;
        do {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&commissionerAppMocks[0].
                             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + lVar5));
          lVar5 = lVar5 + -0x10;
        } while (lVar5 != -8);
      }
      ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&br);
      goto LAB_0014f659;
    }
    testing::Message::Message((Message *)&br);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x37d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&br);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if (br._vptr_BorderRouter != (_func_int **)0x0) {
      (**(code **)(*br._vptr_BorderRouter + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
LAB_0014f659:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_StartCurrentNetworkSuccess)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);

    BorderRouter br;
    br.mNetworkId = 0;
    ASSERT_EQ(ctx.mRegistry->SetCurrentNetwork(br), RegistryStatus::kSuccess);

    uint8_t                camIdx                  = 0;
    CommissionerAppMockPtr commissionerAppMocks[2] = {CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()}};
    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .Times(2)
        .WillRepeatedly(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMocks[camIdx++]; }),
                  Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[0], Start(_, _, _)).Times(2).WillRepeatedly(Return(Error{}));
    // Will be omitted on domain start
    EXPECT_CALL(*commissionerAppMocks[1], Start(_, _, _)).Times(1).WillRepeatedly(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;
    expr  = ctx.mInterpreter.ParseExpression("start --nwk this");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    ctx.mInterpreter.mContext.Cleanup();
    ctx.mInterpreter.mJobManager->CleanupJobs();

    expr  = ctx.mInterpreter.ParseExpression("start --dom this");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}